

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O2

void icetStrategy(IceTEnum strategy)

{
  IceTBoolean IVar1;
  
  IVar1 = icetStrategyValid(strategy);
  if (IVar1 != '\0') {
    icetStateSetInteger(0x24,strategy);
    IVar1 = icetStrategySupportsOrdering(strategy);
    icetStateSetBoolean(0x2b,IVar1);
    return;
  }
  icetRaiseDiagnostic("Invalid strategy.",0xfffffffe,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                      ,0x29);
  return;
}

Assistant:

void icetStrategy(IceTEnum strategy)
{
    if (icetStrategyValid(strategy)) {
        icetStateSetInteger(ICET_STRATEGY, strategy);
        icetStateSetBoolean(ICET_STRATEGY_SUPPORTS_ORDERING,
                            icetStrategySupportsOrdering(strategy));
    } else {
        icetRaiseError("Invalid strategy.", ICET_INVALID_ENUM);
    }
}